

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

void free_exts(void)

{
  char **__ptr;
  long lVar1;
  
  __ptr = exts_i;
  if (exts_i != (char **)0x0) {
    if (0 < num_exts_i) {
      lVar1 = 0;
      do {
        free(__ptr[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < num_exts_i);
    }
    free(__ptr);
    exts_i = (char **)0x0;
  }
  return;
}

Assistant:

static void free_exts(void) {
    if (exts_i != NULL) {
        int index;
        for(index = 0; index < num_exts_i; index++) {
            free((char *)exts_i[index]);
        }
        free((void *)exts_i);
        exts_i = NULL;
    }
}